

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  bool bVar1;
  cmCTestGenericHandler **handler;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  mapped_type *pmVar3;
  long lVar4;
  Part p;
  long lVar5;
  string_view value;
  string_view value_00;
  string envValue;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  _Var2._M_head_impl = (Private *)operator_new(0x2a50);
  Private::Private(_Var2._M_head_impl);
  (this->Impl)._M_t.super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
  _M_t.super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
  super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl = _Var2._M_head_impl;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",&local_48);
  if (bVar1) {
    value._M_str = local_48._M_dataplus._M_p;
    value._M_len = local_48._M_string_length;
    bVar1 = cmValue::IsOff(value);
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputTestOutputOnTestFailure =
         !bVar1;
  }
  local_48._M_string_length = 0;
  *local_48._M_dataplus._M_p = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("CTEST_PROGRESS_OUTPUT",&local_48);
  if (bVar1) {
    value_00._M_str = local_48._M_dataplus._M_p;
    value_00._M_len = local_48._M_string_length;
    bVar1 = cmValue::IsOff(value_00);
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    (_Var2._M_head_impl)->TestProgressOutput = !bVar1;
  }
  else {
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Start",&local_69);
  std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->Parts[0].Name);
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Update",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x60));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Configure",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0xa0));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Build",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0xe0));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Test",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x120));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Coverage",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x160));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"MemCheck",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x1a0));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Submit",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x1e0));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Notes",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x220));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ExtraFiles",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x260));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Upload",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x2a0));
  std::__cxx11::string::~string((string *)&local_68);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Done",&local_69);
  std::__cxx11::string::_M_assign((string *)((long)(_Var2._M_head_impl)->Parts + 0x2e0));
  std::__cxx11::string::~string((string *)&local_68);
  lVar4 = 0x25c0;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    cmsys::SystemTools::LowerCase
              (&local_68,(string *)((long)&(_Var2._M_head_impl)->RepeatCount + lVar4));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&(_Var2._M_head_impl)->PartMap,&local_68);
    *pmVar3 = (mapped_type)lVar5;
    std::__cxx11::string::~string((string *)&local_68);
    lVar4 = lVar4 + 0x40;
  }
  Private::GetTestingHandlers
            ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)&local_68,
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl);
  for (; local_68._M_dataplus._M_p != (pointer)local_68._M_string_length;
      local_68._M_dataplus._M_p = local_68._M_dataplus._M_p + 8) {
    *(cmCTest **)(*(long *)local_68._M_dataplus._M_p + 0x20) = this;
  }
  std::_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
  ~_Vector_base((_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                &local_68);
  cmSystemTools::EnableVSConsoleOutput();
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

cmCTest::cmCTest()
  : Impl(new Private)
{
  std::string envValue;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", envValue)) {
    this->Impl->OutputTestOutputOnTestFailure = !cmIsOff(envValue);
  }
  envValue.clear();
  if (cmSystemTools::GetEnv("CTEST_PROGRESS_OUTPUT", envValue)) {
    this->Impl->TestProgressOutput = !cmIsOff(envValue);
  }

  this->Impl->Parts[PartStart].SetName("Start");
  this->Impl->Parts[PartUpdate].SetName("Update");
  this->Impl->Parts[PartConfigure].SetName("Configure");
  this->Impl->Parts[PartBuild].SetName("Build");
  this->Impl->Parts[PartTest].SetName("Test");
  this->Impl->Parts[PartCoverage].SetName("Coverage");
  this->Impl->Parts[PartMemCheck].SetName("MemCheck");
  this->Impl->Parts[PartSubmit].SetName("Submit");
  this->Impl->Parts[PartNotes].SetName("Notes");
  this->Impl->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Impl->Parts[PartUpload].SetName("Upload");
  this->Impl->Parts[PartDone].SetName("Done");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
    this->Impl
      ->PartMap[cmSystemTools::LowerCase(this->Impl->Parts[p].GetName())] = p;
  }

  for (auto& handler : this->Impl->GetTestingHandlers()) {
    handler->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}